

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O0

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapArrayInfoCore<int,int>
               (SnapArrayInfo<int> *arrayInfo,JavascriptArray *arrayObj,InflateMap *inflator)

{
  int32 newValue;
  int jsVal;
  int ttdVal;
  uint32 i;
  SnapArrayInfoBlock<int> *dataBlock;
  InflateMap *inflator_local;
  JavascriptArray *arrayObj_local;
  SnapArrayInfo<int> *arrayInfo_local;
  
  for (_ttdVal = arrayInfo->Data; _ttdVal != (SnapArrayInfoBlock<int> *)0x0; _ttdVal = _ttdVal->Next
      ) {
    for (jsVal = 0; (uint)jsVal < _ttdVal->LastIndex - _ttdVal->FirstIndex; jsVal = jsVal + 1) {
      if (_ttdVal->ArrayValidTags[(uint)jsVal] != '\0') {
        newValue = SnapArrayInfo_InflateValue(_ttdVal->ArrayRangeContents[(uint)jsVal],inflator);
        Js::JavascriptArray::DirectSetItemAt<int>(arrayObj,jsVal + _ttdVal->FirstIndex,newValue);
      }
    }
  }
  Js::JavascriptArray::SetLength(arrayObj,arrayInfo->Length);
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapArrayInfoCore(SnapArrayInfo<T>* arrayInfo, Js::JavascriptArray* arrayObj, InflateMap* inflator)
        {
            const SnapArrayInfoBlock<T>* dataBlock = arrayInfo->Data;

            while(dataBlock != nullptr)
            {
                for(uint32 i = 0; i < (dataBlock->LastIndex - dataBlock->FirstIndex); ++i)
                {
                    if(dataBlock->ArrayValidTags[i])
                    {
                        T ttdVal = dataBlock->ArrayRangeContents[i];
                        U jsVal = SnapArrayInfo_InflateValue(ttdVal, inflator);

                        arrayObj->DirectSetItemAt<U>(i + dataBlock->FirstIndex, jsVal);
                    }
                }
                dataBlock = dataBlock->Next;
            }

            //Ensure this value is set correctly in case of sparse arrays
            arrayObj->SetLength(arrayInfo->Length);
        }